

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::setNOSIGPIPE(Socket *this)

{
  Socket *this_local;
  
  return 0;
}

Assistant:

int Socket::setNOSIGPIPE() {
#ifdef SYSTEM_NAME_DARWIN
    //LOG(IPC, Sev::Info, "setsockopt() - MacOS specific");
    int on = 1;
    int ret = setSockOpt(SO_NOSIGPIPE, &on, sizeof(on));
    if (ret != 0) {
        //LOG(IPC, Sev::Warning,
        //    fmt::format("Cannot set SO_NOSIGPIPE for socket: {}", strerror(ret)).c_str() );
    }
    assert(ret ==0);
    return ret;
#else
    return 0;
#endif
}